

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

char * __thiscall cmMakefile::CompileFeaturesAvailable(cmMakefile *this,string *lang,string *error)

{
  bool bVar1;
  ostream *poVar2;
  cmake *pcVar3;
  char *pcVar4;
  string local_470;
  string local_450 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  undefined1 local_3b0 [8];
  ostringstream e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  cmMakefile *local_1f8;
  char *featuresKnown;
  string local_1d0 [48];
  undefined1 local_1a0 [8];
  ostringstream e;
  string *error_local;
  string *lang_local;
  cmMakefile *this_local;
  
  bVar1 = cmGlobalGenerator::GetLanguageEnabled(this->GlobalGenerator,lang);
  if (bVar1) {
    std::operator+(&local_238,"CMAKE_",lang);
    std::operator+(&local_218,&local_238,"_COMPILE_FEATURES");
    this_local = (cmMakefile *)GetDefinition(this,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    if ((this_local == (cmMakefile *)0x0) ||
       (*(char *)&(this_local->FindPackageModuleStack).
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map == '\0')) {
      local_1f8 = this_local;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      if (error == (string *)0x0) {
        std::operator<<((ostream *)local_3b0,"No");
      }
      else {
        std::operator<<((ostream *)local_3b0,"no");
      }
      poVar2 = std::operator<<((ostream *)local_3b0," known features for ");
      poVar2 = std::operator<<(poVar2,(string *)lang);
      poVar2 = std::operator<<(poVar2," compiler\n\"");
      std::operator+(&local_3f0,"CMAKE_",lang);
      std::operator+(&local_3d0,&local_3f0,"_COMPILER_ID");
      pcVar4 = GetSafeDefinition(this,&local_3d0);
      poVar2 = std::operator<<(poVar2,pcVar4);
      poVar2 = std::operator<<(poVar2,"\"\nversion ");
      std::operator+(&local_430,"CMAKE_",lang);
      std::operator+(&local_410,&local_430,"_COMPILER_VERSION");
      pcVar4 = GetSafeDefinition(this,&local_410);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::operator<<(poVar2,".");
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
      if (error == (string *)0x0) {
        pcVar3 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(pcVar3,FATAL_ERROR,&local_470,&this->Backtrace);
        std::__cxx11::string::~string((string *)&local_470);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)error,local_450);
        std::__cxx11::string::~string(local_450);
      }
      this_local = (cmMakefile *)0x0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    if (error == (string *)0x0) {
      std::operator<<((ostream *)local_1a0,"Cannot");
    }
    else {
      std::operator<<((ostream *)local_1a0,"cannot");
    }
    poVar2 = std::operator<<((ostream *)local_1a0," use features from non-enabled language ");
    std::operator<<(poVar2,(string *)lang);
    if (error == (string *)0x0) {
      pcVar3 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)&featuresKnown,&this->Backtrace);
      std::__cxx11::string::~string((string *)&featuresKnown);
    }
    else {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)error,local_1d0);
      std::__cxx11::string::~string(local_1d0);
    }
    this_local = (cmMakefile *)0x0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  return (char *)this_local;
}

Assistant:

const char* cmMakefile::CompileFeaturesAvailable(const std::string& lang,
                                                 std::string* error) const
{
  if (!this->GlobalGenerator->GetLanguageEnabled(lang)) {
    std::ostringstream e;
    if (error) {
      e << "cannot";
    } else {
      e << "Cannot";
    }
    e << " use features from non-enabled language " << lang;
    if (error) {
      *error = e.str();
    } else {
      this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                             this->Backtrace);
    }
    return CM_NULLPTR;
  }

  const char* featuresKnown =
    this->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!featuresKnown || !*featuresKnown) {
    std::ostringstream e;
    if (error) {
      e << "no";
    } else {
      e << "No";
    }
    e << " known features for " << lang << " compiler\n\""
      << this->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    if (error) {
      *error = e.str();
    } else {
      this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                             this->Backtrace);
    }
    return CM_NULLPTR;
  }
  return featuresKnown;
}